

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O1

void __thiscall NLReaderTest_PassObj_Test::TestBody(NLReaderTest_PassObj_Test *this)

{
  FunctionMocker<bool_(int)> *this_00;
  FunctionMocker<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  *this_01;
  MockSpec<bool_(int)> *this_02;
  TypedExpectation<bool_(int)> *this_03;
  MockSpec<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)> *this_04;
  TypedExpectation<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
  *this_05;
  long *plVar1;
  mp *pmVar2;
  int in_R9D;
  NLStringRef str;
  NiceMock<MockNLHandler> handler;
  undefined1 local_4a8 [16];
  linked_ptr_internal local_498;
  long lStack_490;
  string local_488;
  undefined1 local_468 [168];
  NLInfo_C local_3c0;
  NiceMock<MockNLHandler> local_358;
  
  testing::NiceMock<MockNLHandler>::NiceMock(&local_358);
  testing::Matcher<int>::Matcher((Matcher<int> *)local_468,0);
  this_00 = &local_358.super_MockNLHandler.gmockconst1_NeedObj_67;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,&local_358);
  this_02 = testing::internal::FunctionMocker<bool_(int)>::With(this_00,(Matcher<int> *)local_468);
  this_03 = testing::internal::MockSpec<bool_(int)>::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x556,"handler","NeedObj(0)");
  local_4a8._0_8_ = operator_new(0x10);
  ((ActionInterface<bool_(int)> *)local_4a8._0_8_)->_vptr_ActionInterface =
       (_func_int **)&PTR__ActionInterface_002f5410;
  *(undefined1 *)&((ActionInterface<bool_(int)> *)(local_4a8._0_8_ + 8))->_vptr_ActionInterface = 1;
  local_4a8._8_8_ = local_4a8 + 8;
  testing::internal::TypedExpectation<bool_(int)>::WillOnce(this_03,(Action<bool_(int)> *)local_4a8)
  ;
  testing::internal::linked_ptr<testing::ActionInterface<bool_(int)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<bool_(int)>_> *)local_4a8);
  local_468._0_8_ = &PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)(local_468 + 8));
  testing::Matcher<int>::Matcher((Matcher<int> *)local_468,0);
  testing::Matcher<int>::Matcher((Matcher<int> *)local_4a8,1);
  this_01 = &local_358.super_MockNLHandler.gmock2_OnLinearObjExpr_69;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_01,&local_358);
  this_04 = testing::internal::
            FunctionMocker<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            ::With(this_01,(Matcher<int> *)local_468,(Matcher<int> *)local_4a8);
  this_05 = testing::internal::
            MockSpec<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
            ::InternalExpectedAt
                      (this_04,
                       "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc"
                       ,0x557,"handler","OnLinearObjExpr(0, 1)");
  local_488._M_dataplus._M_p = (pointer)operator_new(0x10);
  *(undefined ***)local_488._M_dataplus._M_p = &PTR__ActionInterface_002f55f8;
  local_488._M_string_length = (size_type)&local_488._M_string_length;
  testing::internal::
  TypedExpectation<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>::
  WillOnce(this_05,(Action<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>
                    *)&local_488);
  testing::internal::
  linked_ptr<testing::ActionInterface<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>_>
  ::~linked_ptr((linked_ptr<testing::ActionInterface<mp::NLHandler<MockNLHandler,_BasicTestExpr<0>_>::LinearExprHandler_(int,_int)>_>
                 *)&local_488);
  local_4a8._0_8_ = &PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)(local_4a8 + 8));
  local_468._0_8_ = &PTR__MatcherBase_002f24e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)(local_468 + 8));
  memset((NLHeader *)local_468,0,0x110);
  local_3c0.format = 1;
  local_3c0.num_ampl_options = 3;
  local_3c0.prob_name = "nl_instance";
  local_3c0.ampl_vbtol = 0.0;
  local_3c0.arith_kind = 1;
  local_3c0.flags = 1;
  local_3c0.ampl_options[3] = 0;
  local_3c0.ampl_options[4] = 0;
  local_3c0.ampl_options[5] = 0;
  local_3c0.ampl_options[6] = 0;
  local_3c0.ampl_options[7] = 0;
  local_3c0.ampl_options[8] = 0;
  local_3c0.ampl_options[2] = 0;
  local_3c0.ampl_options[0] = 1;
  local_3c0.ampl_options[1] = 1;
  local_468._8_4_ = 1;
  local_468._0_4_ = 1;
  FormatHeader_abi_cxx11_(&local_488,(NLHeader *)local_468,true);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_488);
  pmVar2 = (mp *)(plVar1 + 2);
  if ((mp *)*plVar1 == pmVar2) {
    local_498.next_ = *(linked_ptr_internal **)pmVar2;
    lStack_490 = plVar1[3];
    local_4a8._0_8_ = (mp *)&local_498;
  }
  else {
    local_498.next_ = *(linked_ptr_internal **)pmVar2;
    local_4a8._0_8_ = (mp *)*plVar1;
  }
  local_4a8._8_8_ = plVar1[1];
  *plVar1 = (long)pmVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  str.size_ = (size_t)&local_358;
  str.data_ = (char *)local_4a8._8_8_;
  mp::ReadNLString<testing::NiceMock<MockNLHandler>>
            ((mp *)local_4a8._0_8_,str,(NiceMock<MockNLHandler> *)"(input)",(CStringRef)0x0,in_R9D);
  if ((mp *)local_4a8._0_8_ != (mp *)&local_498) {
    operator_delete((void *)local_4a8._0_8_,(ulong)((long)&(local_498.next_)->next_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  testing::NiceMock<MockNLHandler>::~NiceMock(&local_358);
  return;
}

Assistant:

TEST(NLReaderTest, PassObj) {
  testing::NiceMock<MockNLHandler> handler;
  EXPECT_CALL(handler, NeedObj(0)).WillOnce(Return(true));
  EXPECT_CALL(handler, OnLinearObjExpr(0, 1)).
      WillOnce(Return(MockNLHandler::LinearObjHandler()));
  auto header = NLHeader();
  header.num_vars = header.num_objs = 1;
  ReadNLString(FormatHeader(header) + "G0 1\n0 1\n", handler);
}